

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ByteData * __thiscall
cfd::ConfidentialTransactionContext::CreateSignatureHash
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Script *redeem_script,
          SigHashType *sighash_type,ConfidentialValue *value,WitnessVersion version)

{
  uint32_t txin_index;
  Script *in_RCX;
  undefined8 in_RDX;
  ConfidentialTransaction *in_RSI;
  ByteData *in_RDI;
  SigHashType *in_R8;
  ConfidentialValue *in_R9;
  WitnessVersion in_stack_00000008;
  ByteData256 sighash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  SigHashType local_6c;
  ByteData local_60;
  ByteData256 local_48;
  ConfidentialValue *local_30;
  Script *local_20;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  txin_index = (*(in_RSI->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])(in_RSI,in_RDX);
  core::Script::GetData(&local_60,local_20);
  core::SigHashType::SigHashType(&local_6c,in_R8);
  core::ConfidentialTransaction::GetElementsSignatureHash
            (&local_48,in_RSI,txin_index,&local_60,&local_6c,local_30,in_stack_00000008);
  core::ByteData::~ByteData((ByteData *)0x5822b5);
  core::ByteData256::GetBytes(&local_98,&local_48);
  core::ByteData::ByteData(in_RDI,&local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI);
  core::ByteData256::~ByteData256((ByteData256 *)0x5822f1);
  return in_RDI;
}

Assistant:

ByteData ConfidentialTransactionContext::CreateSignatureHash(
    const OutPoint& outpoint, const Script& redeem_script,
    SigHashType sighash_type, const ConfidentialValue& value,
    WitnessVersion version) const {
  // TODO(k-matsuzawa): For now, when using OP_CODESEPARATOR, divide it on the user side and ask them to specify only the applicable part.  // NOLINT
  ByteData256 sighash = GetElementsSignatureHash(
      GetTxInIndex(outpoint), redeem_script.GetData(), sighash_type, value,
      version);
  return ByteData(sighash.GetBytes());
}